

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_squo
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,size_t ilevel)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  error_flags eVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  csubstr local_50;
  size_t local_40;
  long local_38;
  
  uVar5 = s.len;
  pcVar7 = s.str;
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_do_write(&this->
               super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ,'\'');
  local_38 = ilevel + 1;
  uVar10 = 0;
  uVar8 = uVar10;
  while( true ) {
    do {
      while( true ) {
        if (uVar5 == uVar10) {
          if (uVar8 <= uVar5 && uVar5 - uVar8 != 0) {
            basic_substring<const_char>::basic_substring(&local_50,pcVar7 + uVar8,uVar5 - uVar8);
            WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::_do_write(&this->
                         super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ,local_50);
          }
          WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,'\'');
          return;
        }
        pcVar1 = pcVar7 + uVar10;
        uVar10 = uVar10 + 1;
        if (*pcVar1 != '\'') break;
        if (uVar5 < uVar8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        uVar6 = uVar10;
        if (uVar10 == 0xffffffffffffffff) {
          uVar6 = uVar5;
        }
        local_40 = uVar6 - uVar8;
        if (uVar6 < uVar8) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (uVar5 < uVar6) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_50,pcVar7 + uVar8,local_40);
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,local_50);
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,'\'');
        uVar8 = uVar10;
      }
    } while (*pcVar1 != '\n');
    if (uVar5 < uVar8) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1544,"first >= 0 && first <= len");
    }
    uVar6 = uVar10;
    if (uVar10 == 0xffffffffffffffff) {
      uVar6 = uVar5;
    }
    local_40 = uVar6 - uVar8;
    if (uVar6 < uVar8) break;
    if (uVar5 < uVar6) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1547,"last >= 0 && last <= len");
    }
    basic_substring<const_char>::basic_substring(&local_50,pcVar7 + uVar8,local_40);
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,local_50);
    WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,'\n');
    lVar9 = local_38;
    uVar8 = uVar10;
    if (uVar10 < uVar5) {
      while (lVar9 != 0) {
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,' ');
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,' ');
        lVar9 = lVar9 + -1;
      }
    }
  }
  eVar4 = get_error_flags();
  if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  handle_error(0x1e7ac6,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1546,"first <= last");
}

Assistant:

void Emitter<Writer>::_write_scalar_squo(csubstr s, size_t ilevel)
{
    size_t pos = 0; // tracks the last character that was already written
    this->Writer::_do_write('\'');
    for(size_t i = 0; i < s.len; ++i)
    {
        if(s[i] == '\n')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub);  // write everything up to (including) this char
            this->Writer::_do_write('\n'); // write the character again
            if(i + 1 < s.len)
                _rymlindent_nextline()     // indent the next line
            pos = i+1;
        }
        else if(s[i] == '\'')
        {
            csubstr sub = s.range(pos, i+1);
            this->Writer::_do_write(sub); // write everything up to (including) this char
            this->Writer::_do_write('\''); // write the character again
            pos = i+1;
        }
    }
    // write missing characters at the end of the string
    if(pos < s.len)
        this->Writer::_do_write(s.sub(pos));
    this->Writer::_do_write('\'');
}